

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

bool_t fileTrunc(file_t file,size_t size)

{
  int iVar1;
  
  iVar1 = fileno((FILE *)file);
  iVar1 = ftruncate(iVar1,size);
  return (bool_t)(iVar1 == 0);
}

Assistant:

bool_t fileTrunc(file_t file, size_t size)
{
	ASSERT(fileIsValid(file));
#ifdef _MSC_VER
	return (size_t)(__int64)size == size &&
		_chsize_s(_fileno(file), (__int64)size) == 0;
#else
	return (size_t)(off_t)size == size &&
		ftruncate(fileno(file), (off_t)size) == 0;
#endif
}